

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::process_stmt(Simulator *this,Stmt *stmt,Var *var)

{
  int iVar1;
  runtime_error *this_00;
  
  switch(stmt->type_) {
  case If:
    process_stmt(this,(IfStmt *)stmt,var);
    return;
  case Switch:
    process_stmt(this,(SwitchStmt *)stmt,var);
    return;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not implemented");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case Assign:
    process_stmt(this,(AssignStmt *)stmt,var);
    return;
  case Block:
    break;
  }
  iVar1 = *(int *)&stmt[1].super_IRNode.fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar1 == 1) {
    process_stmt(this,(SequentialStmtBlock *)stmt,var);
    return;
  }
  if (iVar1 == 0) {
    process_stmt(this,(CombinationalStmtBlock *)stmt,var);
    return;
  }
  process_stmt(this,(StmtBlock *)stmt,var);
  return;
}

Assistant:

void Simulator::process_stmt(kratos::Stmt *stmt, const Var *var) {
    switch (stmt->type()) {
        case StatementType::Assign: {
            auto *assign = reinterpret_cast<AssignStmt *>(stmt);
            process_stmt(assign, var);
            break;
        }
        case StatementType::Block: {
            auto *block = reinterpret_cast<StmtBlock *>(stmt);
            if (block->block_type() == StatementBlockType::Combinational) {
                process_stmt(reinterpret_cast<CombinationalStmtBlock *>(block), var);
            } else if (block->block_type() == StatementBlockType::Sequential) {
                process_stmt(reinterpret_cast<SequentialStmtBlock *>(block), var);
            } else {
                process_stmt(block, var);
            }
            break;
        }
        case StatementType::If: {
            auto *if_ = reinterpret_cast<IfStmt *>(stmt);
            process_stmt(if_, var);
            break;
        }
        case StatementType::Switch: {
            auto *switch_ = reinterpret_cast<SwitchStmt *>(stmt);
            process_stmt(switch_, var);
            break;
        }
        default:
            throw std::runtime_error("Not implemented");
    }
}